

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

void __thiscall brynet::net::DataSocket::canRecv(DataSocket *this)

{
  sock __fd;
  size_t sVar1;
  char *pcVar2;
  ssize_t sVar3;
  size_t sVar4;
  size_t sVar5;
  unsigned_long value;
  int *piVar6;
  uint uVar7;
  
  if ((this->mSocket)._M_t.
      super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
      super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
      super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl != (TcpSocket *)0x0) {
    while (sVar1 = ox_buffer_getwritevalidcount(this->mRecvBuffer), sVar1 != 0) {
      __fd = TcpSocket::getFD((this->mSocket)._M_t.
                              super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                              .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
      pcVar2 = ox_buffer_getwriteptr(this->mRecvBuffer);
      sVar3 = ::recv(__fd,pcVar2,(long)(int)sVar1,0);
      uVar7 = (uint)sVar3;
      if (uVar7 == 0) {
LAB_0012ca72:
        procCloseInLoop(this);
        return;
      }
      if ((int)uVar7 < 0) {
        piVar6 = __errno_location();
        if (*piVar6 == 0xb) {
          return;
        }
        goto LAB_0012ca72;
      }
      ox_buffer_addwritepos(this->mRecvBuffer,(ulong)(uVar7 & 0x7fffffff));
      sVar4 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
      sVar5 = ox_buffer_getsize(this->mRecvBuffer);
      if (sVar4 == sVar5) {
        growRecvBuffer(this);
      }
      if ((this->mDataCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        this->mRecvData = true;
        pcVar2 = ox_buffer_getreadptr(this->mRecvBuffer);
        sVar4 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
        value = std::
                function<unsigned_long_(brynet::net::DataSocket_*,_const_char_*,_unsigned_long)>::
                operator()(&this->mDataCallback,this,pcVar2,sVar4);
        sVar4 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
        if (sVar4 < value) {
          __assert_fail("proclen <= ox_buffer_getreadvalidcount(mRecvBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                        ,0x112,"void brynet::net::DataSocket::recv()");
        }
        sVar4 = ox_buffer_getreadvalidcount(this->mRecvBuffer);
        if (sVar4 < value) {
          return;
        }
        ox_buffer_addreadpos(this->mRecvBuffer,value);
      }
      sVar4 = ox_buffer_getwritevalidcount(this->mRecvBuffer);
      if ((sVar4 == 0) || (sVar4 = ox_buffer_getreadvalidcount(this->mRecvBuffer), sVar4 == 0)) {
        ox_buffer_adjustto_head(this->mRecvBuffer);
      }
      if ((int)uVar7 < (int)sVar1) {
        return;
      }
      if ((this->mSocket)._M_t.
          super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>.
          _M_t.
          super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
          .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl == (TcpSocket *)0x0)
      {
        return;
      }
    }
  }
  return;
}

Assistant:

void DataSocket::canRecv()
{
#ifdef PLATFORM_WINDOWS
    mPostRecvCheck = false;
    if (mSocket == nullptr && !mPostWriteCheck)
    {
        onClose();
        return;
    }
#endif

#ifdef USE_OPENSSL
    if (!mIsHandsharked && mSSL != nullptr)
    {
        processSSLHandshake();
        return;
    }
#endif

    recv();
}